

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O1

bool slang::ast::CallExpression::bindArgs
               (ArgumentListSyntax *argSyntax,
               span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
               formalArgs,string_view symbolName,SourceRange range,ASTContext *context,
               SmallVectorBase<const_slang::ast::Expression_*> *boundArgs,bool isBuiltInMethod)

{
  char_pointer puVar1;
  group_type_pointer pgVar2;
  PropertyExprSyntax *initialExpr;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  string_view arg;
  string_view arg_00;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  bool bVar9;
  int iVar10;
  Diagnostic *pDVar11;
  ExpressionSyntax *pEVar12;
  Type *pTVar13;
  uint64_t uVar14;
  SourceLocation SVar15;
  Expression *pEVar16;
  char_pointer puVar17;
  uint uVar18;
  ulong uVar19;
  __extent_storage<18446744073709551615UL> _Var20;
  SyntaxNode *pSVar21;
  long lVar22;
  char_pointer puVar23;
  ulong uVar24;
  pointer ppFVar25;
  ulong uVar26;
  ulong uVar27;
  group_type_pointer pgVar28;
  value_type_pointer ppVar29;
  value_type_pointer ppVar30;
  ulong uVar31;
  ulong uVar32;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>
  *pair;
  table_element_pointer ppVar33;
  FormalArgumentSymbol *this;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  SourceRange SVar53;
  iterator iVar54;
  string_view sVar55;
  SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> orderedArgs;
  NamedArgMap namedArgs;
  byte local_274;
  Expression *local_268;
  FormalArgumentSymbol *local_260;
  ulong local_258;
  long local_250;
  SyntaxNode *local_248;
  size_t local_240;
  Token local_238;
  ulong local_228;
  ulong local_220;
  value_type_pointer local_218;
  group_type_pointer local_210;
  ulong local_208;
  ulong local_200;
  size_t local_1f8;
  char *local_1f0;
  uchar local_1e8;
  uchar uStack_1e7;
  uchar uStack_1e6;
  uchar uStack_1e5;
  uchar uStack_1e4;
  uchar uStack_1e3;
  uchar uStack_1e2;
  uchar uStack_1e1;
  uchar uStack_1e0;
  uchar uStack_1df;
  uchar uStack_1de;
  uchar uStack_1dd;
  uchar uStack_1dc;
  uchar uStack_1db;
  uchar uStack_1da;
  uchar uStack_1d9;
  long local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  SmallVectorBase<const_slang::syntax::SyntaxNode_*> local_1b8 [2];
  undefined1 local_178 [264];
  undefined1 local_70 [32];
  value_type_pointer ppStack_50;
  size_t local_48;
  size_t local_40;
  
  local_1f0 = symbolName._M_str;
  local_1f8 = symbolName._M_len;
  _Var20 = formalArgs._M_extent._M_extent_value;
  ppFVar25 = formalArgs._M_ptr;
  local_1b8[0].data_ = (pointer)local_1b8[0].firstElement;
  local_1b8[0].len = 0;
  local_178._256_8_ = local_178;
  local_70._8_8_ = 0x3f;
  local_70._16_8_ = 1;
  stack0xffffffffffffffa8 = ZEXT816(0x516460);
  local_48 = 0;
  local_1b8[0].cap = 5;
  local_40 = 0;
  local_70._0_8_ = local_178._256_8_;
  if ((argSyntax == (ArgumentListSyntax *)0x0) ||
     (bVar9 = Expression::collectArgs(context,argSyntax,local_1b8,(NamedArgMap *)local_178), bVar9))
  {
    uVar24 = 0;
    if (_Var20._M_extent_value == 0) {
      local_274 = 0;
    }
    else {
      local_1c8 = ppFVar25 + _Var20._M_extent_value;
      local_274 = 0;
      local_240 = _Var20._M_extent_value;
      do {
        this = *ppFVar25;
        local_268 = (Expression *)0x0;
        local_1c0 = ppFVar25;
        if ((uVar24 & 0xffffffff) < local_1b8[0].len) {
          local_248 = *(SyntaxNode **)((long)local_1b8[0].data_ + (uVar24 & 0xffffffff) * 8);
          if (((SyntaxNode *)&local_248->kind)->kind == EmptyArgument) {
            local_268 = FormalArgumentSymbol::getDefaultValue(this);
            if (local_268 == (Expression *)0x0) {
              SVar53 = slang::syntax::SyntaxNode::sourceRange(local_248);
              pDVar11 = ASTContext::addDiag(context,(DiagCode)0x7,SVar53);
              Diagnostic::operator<<
                        (pDVar11,(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
            }
            else if (!isBuiltInMethod) {
              if (this->direction - Out < 2) {
                if (local_268->kind == Assignment) {
                  pEVar16 = (Expression *)local_268[1].constant;
LAB_004a3071:
                  Expression::requireLValue
                            (pEVar16,context,(SourceLocation)0x0,
                             (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0);
                }
              }
              else if ((this->direction == Ref) &&
                      (pEVar16 = local_268, ((this->super_VariableSymbol).flags.m_bits & 1) == 0))
              goto LAB_004a3071;
            }
          }
          else {
            pEVar12 = ASTContext::requireSimpleExpr(context,(PropertyExprSyntax *)local_248);
            if (pEVar12 != (ExpressionSyntax *)0x0) {
              pTVar13 = DeclaredType::getType
                                  (&(this->super_VariableSymbol).super_ValueSymbol.declaredType);
              local_268 = Expression::bindArgument
                                    (pTVar13,this->direction,
                                     (bitmask<slang::ast::VariableFlags>)
                                     (underlying_type)
                                     *(undefined4 *)&(this->super_VariableSymbol).flags,pEVar12,
                                     context);
            }
          }
          uVar24 = (ulong)((int)uVar24 + 1);
          uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              local_70,&(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                                        name);
          uVar26 = uVar14 >> (local_70[8] & 0x3f);
          lVar22 = (uVar14 & 0xff) * 4;
          uVar37 = (&UNK_0051605c)[lVar22];
          uVar38 = (&UNK_0051605d)[lVar22];
          uVar39 = (&UNK_0051605e)[lVar22];
          uVar40 = (&UNK_0051605f)[lVar22];
          local_200 = (ulong)((uint)uVar14 & 7);
          uVar32 = 0;
          uVar19 = local_70._16_8_;
          pgVar28 = (group_type_pointer)local_70._24_8_;
          ppVar29 = ppStack_50;
          uVar41 = uVar37;
          uVar42 = uVar38;
          uVar43 = uVar39;
          uVar44 = uVar40;
          uVar45 = uVar37;
          uVar46 = uVar38;
          uVar47 = uVar39;
          uVar48 = uVar40;
          uVar49 = uVar37;
          uVar50 = uVar38;
          uVar51 = uVar39;
          uVar52 = uVar40;
          do {
            pgVar2 = pgVar28 + uVar26;
            auVar35[0] = -(pgVar2->m[0].n == uVar37);
            auVar35[1] = -(pgVar2->m[1].n == uVar38);
            auVar35[2] = -(pgVar2->m[2].n == uVar39);
            auVar35[3] = -(pgVar2->m[3].n == uVar40);
            auVar35[4] = -(pgVar2->m[4].n == uVar41);
            auVar35[5] = -(pgVar2->m[5].n == uVar42);
            auVar35[6] = -(pgVar2->m[6].n == uVar43);
            auVar35[7] = -(pgVar2->m[7].n == uVar44);
            auVar35[8] = -(pgVar2->m[8].n == uVar45);
            auVar35[9] = -(pgVar2->m[9].n == uVar46);
            auVar35[10] = -(pgVar2->m[10].n == uVar47);
            auVar35[0xb] = -(pgVar2->m[0xb].n == uVar48);
            auVar35[0xc] = -(pgVar2->m[0xc].n == uVar49);
            auVar35[0xd] = -(pgVar2->m[0xd].n == uVar50);
            auVar35[0xe] = -(pgVar2->m[0xe].n == uVar51);
            auVar35[0xf] = -(pgVar2->m[0xf].n == uVar52);
            uVar18 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
            uVar27 = uVar26;
            ppVar30 = ppVar29;
            uVar31 = uVar32;
            lVar22 = uVar26 * 0x10;
            if (uVar18 != 0) {
              sVar3 = (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
              pcVar4 = (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
              local_260 = this;
              local_258 = uVar24;
              local_228 = uVar32;
              local_220 = uVar19;
              local_218 = ppVar29;
              local_210 = pgVar28;
              local_208 = uVar26;
              local_1e8 = uVar37;
              uStack_1e7 = uVar38;
              uStack_1e6 = uVar39;
              uStack_1e5 = uVar40;
              uStack_1e4 = uVar41;
              uStack_1e3 = uVar42;
              uStack_1e2 = uVar43;
              uStack_1e1 = uVar44;
              uStack_1e0 = uVar45;
              uStack_1df = uVar46;
              uStack_1de = uVar47;
              uStack_1dd = uVar48;
              uStack_1dc = uVar49;
              uStack_1db = uVar50;
              uStack_1da = uVar51;
              uStack_1d9 = uVar52;
              local_1d0 = uVar26 * 0x10;
              do {
                iVar10 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                  }
                }
                bVar9 = sVar3 == *(size_t *)
                                  ((long)&ppVar29[uVar26 * 0xf].first._M_len +
                                  (ulong)(uint)(iVar10 << 5));
                lVar22 = (long)&ppVar29[uVar26 * 0xf].first._M_len + (ulong)(uint)(iVar10 << 5);
                if (bVar9 && sVar3 != 0) {
                  iVar10 = bcmp(pcVar4,*(void **)(lVar22 + 8),sVar3);
                  bVar9 = iVar10 == 0;
                  uVar37 = local_1e8;
                  uVar38 = uStack_1e7;
                  uVar39 = uStack_1e6;
                  uVar40 = uStack_1e5;
                  uVar41 = uStack_1e4;
                  uVar42 = uStack_1e3;
                  uVar43 = uStack_1e2;
                  uVar44 = uStack_1e1;
                  uVar45 = uStack_1e0;
                  uVar46 = uStack_1df;
                  uVar47 = uStack_1de;
                  uVar48 = uStack_1dd;
                  uVar49 = uStack_1dc;
                  uVar50 = uStack_1db;
                  uVar51 = uStack_1da;
                  uVar52 = uStack_1d9;
                }
                uVar24 = local_258;
                this = local_260;
                if (bVar9) goto LAB_004a3227;
                uVar18 = uVar18 - 1 & uVar18;
                uVar19 = local_220;
                uVar27 = local_208;
                pgVar28 = local_210;
                ppVar30 = local_218;
                uVar31 = local_228;
                lVar22 = local_1d0;
              } while (uVar18 != 0);
            }
            if ((pgVar28->m[lVar22 + 0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[local_200]) == 0) break;
            uVar32 = uVar31 + 1;
            uVar26 = uVar27 + uVar31 + 1 & uVar19;
            ppVar29 = ppVar30;
          } while (uVar32 <= uVar19);
          lVar22 = 0;
LAB_004a3227:
          _Var20._M_extent_value = local_240;
          local_200 = lVar22;
          if (lVar22 != 0) {
            SVar15 = parsing::Token::location((Token *)(*(long *)(lVar22 + 0x10) + 0x28));
            _Var20._M_extent_value = local_240;
            pDVar11 = ASTContext::addDiag(context,(DiagCode)0x4a0007,SVar15);
            Diagnostic::operator<<
                      (pDVar11,(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
            local_238 = slang::syntax::SyntaxNode::getFirstToken(local_248);
            SVar15 = parsing::Token::location(&local_238);
            Diagnostic::addNote(pDVar11,(DiagCode)0xc0001,SVar15);
            *(undefined1 *)(lVar22 + 0x18) = 1;
            local_274 = 1;
          }
LAB_004a3379:
          bVar6 = false;
          if (local_268 == (Expression *)0x0) {
            local_274 = 1;
          }
          else {
            bVar9 = Expression::bad(local_268);
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)boundArgs,&local_268);
            local_274 = local_274 | bVar9;
          }
        }
        else {
          uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              local_70,&(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                                        name);
          uVar26 = uVar14 >> (local_70[8] & 0x3f);
          lVar22 = (uVar14 & 0xff) * 4;
          uVar37 = (&UNK_0051605c)[lVar22];
          uVar38 = (&UNK_0051605d)[lVar22];
          uVar39 = (&UNK_0051605e)[lVar22];
          uVar40 = (&UNK_0051605f)[lVar22];
          pSVar21 = (SyntaxNode *)(ulong)((uint)uVar14 & 7);
          uVar32 = 0;
          uVar19 = local_70._16_8_;
          pgVar28 = (group_type_pointer)local_70._24_8_;
          ppVar29 = ppStack_50;
          uVar41 = uVar37;
          uVar42 = uVar38;
          uVar43 = uVar39;
          uVar44 = uVar40;
          uVar45 = uVar37;
          uVar46 = uVar38;
          uVar47 = uVar39;
          uVar48 = uVar40;
          uVar49 = uVar37;
          uVar50 = uVar38;
          uVar51 = uVar39;
          uVar52 = uVar40;
          do {
            pgVar2 = pgVar28 + uVar26;
            auVar34[0] = -(pgVar2->m[0].n == uVar37);
            auVar34[1] = -(pgVar2->m[1].n == uVar38);
            auVar34[2] = -(pgVar2->m[2].n == uVar39);
            auVar34[3] = -(pgVar2->m[3].n == uVar40);
            auVar34[4] = -(pgVar2->m[4].n == uVar41);
            auVar34[5] = -(pgVar2->m[5].n == uVar42);
            auVar34[6] = -(pgVar2->m[6].n == uVar43);
            auVar34[7] = -(pgVar2->m[7].n == uVar44);
            auVar34[8] = -(pgVar2->m[8].n == uVar45);
            auVar34[9] = -(pgVar2->m[9].n == uVar46);
            auVar34[10] = -(pgVar2->m[10].n == uVar47);
            auVar34[0xb] = -(pgVar2->m[0xb].n == uVar48);
            auVar34[0xc] = -(pgVar2->m[0xc].n == uVar49);
            auVar34[0xd] = -(pgVar2->m[0xd].n == uVar50);
            auVar34[0xe] = -(pgVar2->m[0xe].n == uVar51);
            auVar34[0xf] = -(pgVar2->m[0xf].n == uVar52);
            uVar18 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
            uVar27 = uVar26;
            ppVar30 = ppVar29;
            uVar31 = uVar32;
            if (uVar18 != 0) {
              sVar3 = (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
              pcVar4 = (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
              local_260 = this;
              local_258 = uVar24;
              local_248 = pSVar21;
              local_228 = uVar32;
              local_220 = uVar19;
              local_218 = ppVar29;
              local_210 = pgVar28;
              local_208 = uVar26;
              local_1e8 = uVar37;
              uStack_1e7 = uVar38;
              uStack_1e6 = uVar39;
              uStack_1e5 = uVar40;
              uStack_1e4 = uVar41;
              uStack_1e3 = uVar42;
              uStack_1e2 = uVar43;
              uStack_1e1 = uVar44;
              uStack_1e0 = uVar45;
              uStack_1df = uVar46;
              uStack_1de = uVar47;
              uStack_1dd = uVar48;
              uStack_1dc = uVar49;
              uStack_1db = uVar50;
              uStack_1da = uVar51;
              uStack_1d9 = uVar52;
              do {
                iVar10 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                  }
                }
                bVar9 = sVar3 == *(size_t *)
                                  ((long)&ppVar29[uVar26 * 0xf].first._M_len +
                                  (ulong)(uint)(iVar10 << 5));
                lVar22 = (long)&ppVar29[uVar26 * 0xf].first._M_len + (ulong)(uint)(iVar10 << 5);
                if (bVar9 && sVar3 != 0) {
                  iVar10 = bcmp(pcVar4,*(void **)(lVar22 + 8),sVar3);
                  bVar9 = iVar10 == 0;
                  uVar37 = local_1e8;
                  uVar38 = uStack_1e7;
                  uVar39 = uStack_1e6;
                  uVar40 = uStack_1e5;
                  uVar41 = uStack_1e4;
                  uVar42 = uStack_1e3;
                  uVar43 = uStack_1e2;
                  uVar44 = uStack_1e1;
                  uVar45 = uStack_1e0;
                  uVar46 = uStack_1df;
                  uVar47 = uStack_1de;
                  uVar48 = uStack_1dd;
                  uVar49 = uStack_1dc;
                  uVar50 = uStack_1db;
                  uVar51 = uStack_1da;
                  uVar52 = uStack_1d9;
                }
                uVar24 = local_258;
                this = local_260;
                if (bVar9) goto LAB_004a2e9f;
                uVar18 = uVar18 - 1 & uVar18;
                uVar19 = local_220;
                pSVar21 = local_248;
                uVar27 = local_208;
                pgVar28 = local_210;
                ppVar30 = local_218;
                uVar31 = local_228;
              } while (uVar18 != 0);
            }
            if ((pgVar28[uVar26].m[0xf].n & (char)((SyntaxNode *)&pSVar21[0x3642e].kind)->kind) ==
                Unknown) break;
            uVar32 = uVar31 + 1;
            uVar26 = uVar27 + uVar31 + 1 & uVar19;
            ppVar29 = ppVar30;
          } while (uVar32 <= uVar19);
          local_250 = 0;
          lVar22 = local_250;
LAB_004a2e9f:
          local_250 = lVar22;
          _Var20._M_extent_value = local_240;
          if (local_250 == 0) {
            local_268 = FormalArgumentSymbol::getDefaultValue(this);
            _Var20._M_extent_value = local_240;
            if (local_268 == (Expression *)0x0) {
              if (local_40 != 0) {
                pDVar11 = ASTContext::addDiag(context,(DiagCode)0xa20007,range);
                Diagnostic::operator<<
                          (pDVar11,(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name)
                ;
                goto LAB_004a3057;
              }
              pDVar11 = ASTContext::addDiag(context,(DiagCode)0x9f0007,range);
              sVar55._M_str = local_1f0;
              sVar55._M_len = local_1f8;
              Diagnostic::operator<<(pDVar11,sVar55);
              sVar8 = local_240;
              local_240._0_2_ = (undefined2)_Var20._M_extent_value;
              local_240._2_1_ = SUB81(_Var20._M_extent_value,2);
              local_240._3_1_ = SUB81(_Var20._M_extent_value,3);
              local_240._4_4_ = SUB84(_Var20._M_extent_value,4);
              local_238.kind = (undefined2)local_240;
              local_238._2_1_ = local_240._2_1_;
              local_238.numFlags.raw = local_240._3_1_;
              local_238.rawLen = local_240._4_4_;
              local_240 = sVar8;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)&local_238);
              local_238.kind = (undefined2)local_1b8[0].len;
              local_238._2_1_ = local_1b8[0].len._2_1_;
              local_238.numFlags.raw = local_1b8[0].len._3_1_;
              local_238.rawLen = local_1b8[0].len._4_4_;
              std::
              vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
              ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)&local_238);
              bVar6 = true;
              local_274 = 1;
              bVar9 = false;
            }
            else {
              bVar6 = false;
              bVar9 = true;
              if (!isBuiltInMethod) {
                if (this->direction - Out < 2) {
                  if (local_268->kind == Assignment) {
                    pEVar16 = (Expression *)local_268[1].constant;
LAB_004a32c3:
                    bVar6 = false;
                    Expression::requireLValue
                              (pEVar16,context,(SourceLocation)0x0,
                               (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0);
                  }
                }
                else if ((this->direction == Ref) &&
                        (pEVar16 = local_268, ((this->super_VariableSymbol).flags.m_bits & 1) == 0))
                goto LAB_004a32c3;
              }
            }
          }
          else {
            *(undefined1 *)(local_250 + 0x18) = 1;
            initialExpr = *(PropertyExprSyntax **)(*(long *)(local_250 + 0x10) + 0x48);
            if (initialExpr == (PropertyExprSyntax *)0x0) {
              local_268 = FormalArgumentSymbol::getDefaultValue(this);
              if (local_268 == (Expression *)0x0) {
                SVar53 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(local_250 + 0x10));
                pDVar11 = ASTContext::addDiag(context,(DiagCode)0x7,SVar53);
                Diagnostic::operator<<
                          (pDVar11,(this->super_VariableSymbol).super_ValueSymbol.super_Symbol.name)
                ;
LAB_004a3057:
                bVar6 = false;
                bVar9 = true;
              }
              else {
                bVar7 = false;
                bVar9 = true;
                bVar6 = false;
                if (!isBuiltInMethod) {
                  bVar6 = bVar7;
                  if (this->direction - Out < 2) {
                    if (local_268->kind == Assignment) {
                      pEVar16 = (Expression *)local_268[1].constant;
LAB_004a3358:
                      Expression::requireLValue
                                (pEVar16,context,(SourceLocation)0x0,
                                 (bitmask<slang::ast::AssignFlags>)0x0,(Expression *)0x0);
                      bVar6 = false;
                    }
                  }
                  else if ((this->direction == Ref) &&
                          (pEVar16 = local_268, ((this->super_VariableSymbol).flags.m_bits & 1) == 0
                          )) goto LAB_004a3358;
                }
              }
            }
            else {
              pEVar12 = ASTContext::requireSimpleExpr(context,initialExpr);
              bVar9 = true;
              bVar6 = false;
              if (pEVar12 != (ExpressionSyntax *)0x0) {
                pTVar13 = DeclaredType::getType
                                    (&(this->super_VariableSymbol).super_ValueSymbol.declaredType);
                local_268 = Expression::bindArgument
                                      (pTVar13,this->direction,
                                       (bitmask<slang::ast::VariableFlags>)
                                       (underlying_type)
                                       *(undefined4 *)&(this->super_VariableSymbol).flags,pEVar12,
                                       context);
              }
            }
          }
          if (bVar9) goto LAB_004a3379;
        }
        ppFVar25 = local_1c0 + 1;
      } while (ppFVar25 != local_1c8 && !bVar6);
      uVar24 = uVar24 & 0xffffffff;
    }
    if (uVar24 < local_1b8[0].len) {
      pDVar11 = ASTContext::addDiag(context,(DiagCode)0xa00007,range);
      arg._M_str = local_1f0;
      arg._M_len = local_1f8;
      Diagnostic::operator<<(pDVar11,arg);
      local_238._0_8_ = _Var20._M_extent_value;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)&local_238);
      local_238.kind = (undefined2)local_1b8[0].len;
      local_238._2_1_ = local_1b8[0].len._2_1_;
      local_238.numFlags.raw = local_1b8[0].len._3_1_;
      local_238.rawLen = local_1b8[0].len._4_4_;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)&local_238);
      local_274 = 1;
    }
    iVar54 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
                      *)local_70);
    if (iVar54.p_ != (table_element_pointer)0x0) {
LAB_004a3476:
      ppVar33 = iVar54.p_;
      if ((ppVar33->second).second == false) {
        SVar15 = parsing::Token::location(&((ppVar33->second).first)->name);
        pDVar11 = ASTContext::addDiag(context,(DiagCode)0x10007,SVar15);
        sVar55 = parsing::Token::valueText(&((ppVar33->second).first)->name);
        Diagnostic::operator<<(pDVar11,sVar55);
        local_274 = 1;
        arg_00._M_str = local_1f0;
        arg_00._M_len = local_1f8;
        Diagnostic::operator<<(pDVar11,arg_00);
      }
      puVar17 = iVar54.pc_ + 2;
      do {
        puVar23 = puVar17;
        puVar17 = iVar54.pc_;
        ppVar33 = iVar54.p_ + 1;
        if (((uint)iVar54.pc_ & 0xf) == 0xe) goto LAB_004a350f;
        puVar1 = puVar23 + -1;
        iVar54.p_ = ppVar33;
        iVar54.pc_ = puVar17 + 1;
        puVar17 = puVar23 + 1;
      } while (*puVar1 == '\0');
      puVar23 = puVar23 + -1;
      if (*puVar1 == '\x01') {
        ppVar33 = (table_element_pointer)0x0;
      }
      goto LAB_004a34ff;
    }
LAB_004a355f:
    bVar9 = (bool)(local_274 ^ 1);
  }
  else {
    bVar9 = false;
  }
  boost::unordered::detail::foa::
  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
  ::delete_((allocator_type)local_70._0_8_,
            (table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::NamedArgumentSyntax_*,_bool>_>,_256UL,_16UL>_>
             *)(local_70 + 8));
  if (local_1b8[0].data_ != (pointer)local_1b8[0].firstElement) {
    operator_delete(local_1b8[0].data_);
  }
  return bVar9;
LAB_004a350f:
  do {
    auVar36[0] = -(*puVar23 == '\0');
    auVar36[1] = -(puVar23[1] == '\0');
    auVar36[2] = -(puVar23[2] == '\0');
    auVar36[3] = -(puVar23[3] == '\0');
    auVar36[4] = -(puVar23[4] == '\0');
    auVar36[5] = -(puVar23[5] == '\0');
    auVar36[6] = -(puVar23[6] == '\0');
    auVar36[7] = -(puVar23[7] == '\0');
    auVar36[8] = -(puVar23[8] == '\0');
    auVar36[9] = -(puVar23[9] == '\0');
    auVar36[10] = -(puVar23[10] == '\0');
    auVar36[0xb] = -(puVar23[0xb] == '\0');
    auVar36[0xc] = -(puVar23[0xc] == '\0');
    auVar36[0xd] = -(puVar23[0xd] == '\0');
    auVar36[0xe] = -(puVar23[0xe] == '\0');
    auVar36[0xf] = -(puVar23[0xf] == '\0');
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
    if (uVar18 == 0x7fff) {
      puVar23 = puVar23 + 0x10;
      ppVar33 = ppVar33 + 0xf;
    }
    else {
      uVar5 = 0;
      if ((uVar18 ^ 0x7fff) != 0) {
        for (; ((uVar18 ^ 0x7fff) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if (puVar23[uVar5] == '\x01') {
        ppVar33 = (table_element_pointer)0x0;
      }
      else {
        puVar23 = puVar23 + uVar5;
        ppVar33 = (table_element_pointer)((long)&(ppVar33->first)._M_len + (ulong)(uVar5 << 5));
      }
    }
  } while (uVar18 == 0x7fff);
LAB_004a34ff:
  iVar54.p_ = ppVar33;
  iVar54.pc_ = puVar23;
  if (ppVar33 == (table_element_pointer)0x0) goto LAB_004a355f;
  goto LAB_004a3476;
}

Assistant:

bool CallExpression::bindArgs(const ArgumentListSyntax* argSyntax,
                              std::span<const FormalArgumentSymbol* const> formalArgs,
                              std::string_view symbolName, SourceRange range,
                              const ASTContext& context,
                              SmallVectorBase<const Expression*>& boundArgs, bool isBuiltInMethod) {
    SmallVector<const SyntaxNode*> orderedArgs;
    NamedArgMap namedArgs;
    if (argSyntax) {
        if (!collectArgs(context, *argSyntax, orderedArgs, namedArgs))
            return false;
    }

    // Helper function to register a driver for default value arguments.
    auto addDefaultDriver = [&](const Expression& expr, const FormalArgumentSymbol& formal) {
        if (isBuiltInMethod)
            return;

        switch (formal.direction) {
            case ArgumentDirection::In:
                // Nothing to do for inputs.
                break;
            case ArgumentDirection::Out:
            case ArgumentDirection::InOut:
                // The default value binding should always use bindLValue() which
                // will always return either an AssignmentExpression or a bad expr.
                SLANG_ASSERT(expr.kind == ExpressionKind::Assignment || expr.bad());
                if (expr.kind == ExpressionKind::Assignment)
                    expr.as<AssignmentExpression>().left().requireLValue(context);
                break;
            case ArgumentDirection::Ref:
                if (!formal.flags.has(VariableFlags::Const))
                    expr.requireLValue(context);
                break;
        }
    };

    bool bad = false;
    uint32_t orderedIndex = 0;
    for (auto formal : formalArgs) {
        const Expression* expr = nullptr;
        if (orderedIndex < orderedArgs.size()) {
            auto arg = orderedArgs[orderedIndex++];
            if (arg->kind == SyntaxKind::EmptyArgument) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getDefaultValue();
                if (!expr)
                    context.addDiag(diag::ArgCannotBeEmpty, arg->sourceRange()) << formal->name;
                else
                    addDefaultDriver(*expr, *formal);
            }
            else if (auto exSyn = context.requireSimpleExpr(arg->as<PropertyExprSyntax>())) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction,
                                                 formal->flags, *exSyn, context);
            }

            // Make sure there isn't also a named value for this argument.
            if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
                auto& diag = context.addDiag(diag::DuplicateArgAssignment,
                                             it->second.first->name.location());
                diag << formal->name;
                diag.addNote(diag::NotePreviousUsage, arg->getFirstToken().location());
                it->second.second = true;
                bad = true;
            }
        }
        else if (auto it = namedArgs.find(formal->name); it != namedArgs.end()) {
            // Mark this argument as used so that we can later detect if
            // any were unused.
            it->second.second = true;

            auto arg = it->second.first->expr;
            if (!arg) {
                // Empty arguments are allowed as long as a default is provided.
                expr = formal->getDefaultValue();
                if (!expr) {
                    context.addDiag(diag::ArgCannotBeEmpty, it->second.first->sourceRange())
                        << formal->name;
                }
                else {
                    addDefaultDriver(*expr, *formal);
                }
            }
            else if (auto exSyn = context.requireSimpleExpr(*arg)) {
                expr = &Expression::bindArgument(formal->getType(), formal->direction,
                                                 formal->flags, *exSyn, context);
            }
        }
        else {
            expr = formal->getDefaultValue();
            if (!expr) {
                if (namedArgs.empty()) {
                    auto& diag = context.addDiag(diag::TooFewArguments, range);
                    diag << symbolName;
                    diag << formalArgs.size() << orderedArgs.size();
                    bad = true;
                    break;
                }
                else {
                    context.addDiag(diag::UnconnectedArg, range) << formal->name;
                }
            }
            else {
                addDefaultDriver(*expr, *formal);
            }
        }

        if (!expr) {
            bad = true;
        }
        else {
            bad |= expr->bad();
            boundArgs.push_back(expr);
        }
    }

    // Make sure there weren't too many ordered arguments provided.
    if (orderedIndex < orderedArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, range);
        diag << symbolName;
        diag << formalArgs.size();
        diag << orderedArgs.size();
        bad = true;
    }

    for (const auto& pair : namedArgs) {
        // We marked all the args that we used, so anything left over is an arg assignment
        // for a non-existent arg.
        if (!pair.second.second) {
            auto& diag = context.addDiag(diag::ArgDoesNotExist, pair.second.first->name.location());
            diag << pair.second.first->name.valueText();
            diag << symbolName;
            bad = true;
        }
    }

    return !bad;
}